

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O3

int HasAlpha32b_SSE2(uint8_t *src,int length)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  iVar18 = length * 4 + -3;
  lVar17 = (long)iVar18;
  lVar19 = 0;
  do {
    if (lVar17 < lVar19 + 0x40) {
      do {
        if (lVar17 < lVar19 + 0x20) {
          if (iVar18 < (int)lVar19) {
            return 0;
          }
          do {
            if (src[lVar19] != 0xff) {
              return 1;
            }
            lVar19 = lVar19 + 4;
          } while (lVar19 <= lVar17);
          return 0;
        }
        auVar20 = packssdw(*(undefined1 (*) [16])(src + lVar19) & _DAT_00155810,
                           *(undefined1 (*) [16])(src + lVar19 + 0x10) & _DAT_00155810);
        sVar1 = auVar20._0_2_;
        sVar2 = auVar20._2_2_;
        sVar3 = auVar20._4_2_;
        sVar4 = auVar20._6_2_;
        sVar5 = auVar20._8_2_;
        sVar6 = auVar20._10_2_;
        sVar7 = auVar20._12_2_;
        sVar8 = auVar20._14_2_;
        auVar22[0] = -((char)((0 < sVar1) * (sVar1 < 0x100) * auVar20[0] - (0xff < sVar1)) == -1);
        auVar22[1] = -((char)((0 < sVar2) * (sVar2 < 0x100) * auVar20[2] - (0xff < sVar2)) == -1);
        auVar22[2] = -((char)((0 < sVar3) * (sVar3 < 0x100) * auVar20[4] - (0xff < sVar3)) == -1);
        auVar22[3] = -((char)((0 < sVar4) * (sVar4 < 0x100) * auVar20[6] - (0xff < sVar4)) == -1);
        auVar22[4] = -((char)((0 < sVar5) * (sVar5 < 0x100) * auVar20[8] - (0xff < sVar5)) == -1);
        auVar22[5] = -((char)((0 < sVar6) * (sVar6 < 0x100) * auVar20[10] - (0xff < sVar6)) == -1);
        auVar22[6] = -((char)((0 < sVar7) * (sVar7 < 0x100) * auVar20[0xc] - (0xff < sVar7)) == -1);
        auVar22[7] = -((char)((0 < sVar8) * (sVar8 < 0x100) * auVar20[0xe] - (0xff < sVar8)) == -1);
        auVar22[8] = -((char)((0 < sVar1) * (sVar1 < 0x100) * auVar20[0] - (0xff < sVar1)) == -1);
        auVar22[9] = -((char)((0 < sVar2) * (sVar2 < 0x100) * auVar20[2] - (0xff < sVar2)) == -1);
        auVar22[10] = -((char)((0 < sVar3) * (sVar3 < 0x100) * auVar20[4] - (0xff < sVar3)) == -1);
        auVar22[0xb] = -((char)((0 < sVar4) * (sVar4 < 0x100) * auVar20[6] - (0xff < sVar4)) == -1);
        auVar22[0xc] = -((char)((0 < sVar5) * (sVar5 < 0x100) * auVar20[8] - (0xff < sVar5)) == -1);
        auVar22[0xd] = -((char)((0 < sVar6) * (sVar6 < 0x100) * auVar20[10] - (0xff < sVar6)) == -1)
        ;
        auVar22[0xe] = -((char)((0 < sVar7) * (sVar7 < 0x100) * auVar20[0xc] - (0xff < sVar7)) == -1
                        );
        auVar22[0xf] = -((char)((0 < sVar8) * (sVar8 < 0x100) * auVar20[0xe] - (0xff < sVar8)) == -1
                        );
        lVar19 = lVar19 + 0x20;
      } while ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
      return 1;
    }
    auVar20 = packssdw(*(undefined1 (*) [16])(src + lVar19) & _DAT_00155810,
                       *(undefined1 (*) [16])(src + lVar19 + 0x10) & _DAT_00155810);
    auVar22 = packssdw(*(undefined1 (*) [16])(src + lVar19 + 0x20) & _DAT_00155810,
                       *(undefined1 (*) [16])(src + lVar19 + 0x30) & _DAT_00155810);
    sVar1 = auVar20._0_2_;
    sVar2 = auVar20._2_2_;
    sVar3 = auVar20._4_2_;
    sVar4 = auVar20._6_2_;
    sVar5 = auVar20._8_2_;
    sVar6 = auVar20._10_2_;
    sVar7 = auVar20._12_2_;
    sVar8 = auVar20._14_2_;
    sVar9 = auVar22._0_2_;
    sVar10 = auVar22._2_2_;
    sVar11 = auVar22._4_2_;
    sVar12 = auVar22._6_2_;
    sVar13 = auVar22._8_2_;
    sVar14 = auVar22._10_2_;
    sVar15 = auVar22._12_2_;
    sVar16 = auVar22._14_2_;
    auVar21[0] = -((char)((0 < sVar1) * (sVar1 < 0x100) * auVar20[0] - (0xff < sVar1)) == -1);
    auVar21[1] = -((char)((0 < sVar2) * (sVar2 < 0x100) * auVar20[2] - (0xff < sVar2)) == -1);
    auVar21[2] = -((char)((0 < sVar3) * (sVar3 < 0x100) * auVar20[4] - (0xff < sVar3)) == -1);
    auVar21[3] = -((char)((0 < sVar4) * (sVar4 < 0x100) * auVar20[6] - (0xff < sVar4)) == -1);
    auVar21[4] = -((char)((0 < sVar5) * (sVar5 < 0x100) * auVar20[8] - (0xff < sVar5)) == -1);
    auVar21[5] = -((char)((0 < sVar6) * (sVar6 < 0x100) * auVar20[10] - (0xff < sVar6)) == -1);
    auVar21[6] = -((char)((0 < sVar7) * (sVar7 < 0x100) * auVar20[0xc] - (0xff < sVar7)) == -1);
    auVar21[7] = -((char)((0 < sVar8) * (sVar8 < 0x100) * auVar20[0xe] - (0xff < sVar8)) == -1);
    auVar21[8] = -((char)((0 < sVar9) * (sVar9 < 0x100) * auVar22[0] - (0xff < sVar9)) == -1);
    auVar21[9] = -((char)((0 < sVar10) * (sVar10 < 0x100) * auVar22[2] - (0xff < sVar10)) == -1);
    auVar21[10] = -((char)((0 < sVar11) * (sVar11 < 0x100) * auVar22[4] - (0xff < sVar11)) == -1);
    auVar21[0xb] = -((char)((0 < sVar12) * (sVar12 < 0x100) * auVar22[6] - (0xff < sVar12)) == -1);
    auVar21[0xc] = -((char)((0 < sVar13) * (sVar13 < 0x100) * auVar22[8] - (0xff < sVar13)) == -1);
    auVar21[0xd] = -((char)((0 < sVar14) * (sVar14 < 0x100) * auVar22[10] - (0xff < sVar14)) == -1);
    auVar21[0xe] = -((char)((0 < sVar15) * (sVar15 < 0x100) * auVar22[0xc] - (0xff < sVar15)) == -1)
    ;
    auVar21[0xf] = -((char)((0 < sVar16) * (sVar16 < 0x100) * auVar22[0xe] - (0xff < sVar16)) == -1)
    ;
    lVar19 = lVar19 + 0x40;
  } while ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
  return 1;
}

Assistant:

static int HasAlpha32b_SSE2(const uint8_t* src, int length) {
  const __m128i alpha_mask = _mm_set1_epi32(0xff);
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  int i = 0;
  // We don't know if we can access the last 3 bytes after the last alpha
  // value 'src[4 * length - 4]' (because we don't know if alpha is the first
  // or the last byte of the quadruplet). Hence the '-3' protection below.
  length = length * 4 - 3;   // size in bytes
  for (; i + 64 <= length; i += 64) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i +  0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 16));
    const __m128i a2 = _mm_loadu_si128((const __m128i*)(src + i + 32));
    const __m128i a3 = _mm_loadu_si128((const __m128i*)(src + i + 48));
    const __m128i b0 = _mm_and_si128(a0, alpha_mask);
    const __m128i b1 = _mm_and_si128(a1, alpha_mask);
    const __m128i b2 = _mm_and_si128(a2, alpha_mask);
    const __m128i b3 = _mm_and_si128(a3, alpha_mask);
    const __m128i c0 = _mm_packs_epi32(b0, b1);
    const __m128i c1 = _mm_packs_epi32(b2, b3);
    const __m128i d  = _mm_packus_epi16(c0, c1);
    const __m128i bits = _mm_cmpeq_epi8(d, all_0xff);
    const int mask = _mm_movemask_epi8(bits);
    if (mask != 0xffff) return 1;
  }
  for (; i + 32 <= length; i += 32) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i +  0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 16));
    const __m128i b0 = _mm_and_si128(a0, alpha_mask);
    const __m128i b1 = _mm_and_si128(a1, alpha_mask);
    const __m128i c  = _mm_packs_epi32(b0, b1);
    const __m128i d  = _mm_packus_epi16(c, c);
    const __m128i bits = _mm_cmpeq_epi8(d, all_0xff);
    const int mask = _mm_movemask_epi8(bits);
    if (mask != 0xffff) return 1;
  }
  for (; i <= length; i += 4) if (src[i] != 0xff) return 1;
  return 0;
}